

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O2

int Gia_ManSimulateWords(Gia_Man_t *p,int nWords)

{
  Vec_Wrd_t *pVVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  word *pwVar4;
  word wVar5;
  uint uVar6;
  int v;
  long lVar7;
  
  Vec_WrdFreeP(&p->vSims);
  pVVar1 = Vec_WrdStart(p->nObjs * nWords);
  p->vSims = pVVar1;
  p->nSimWords = nWords;
  v = 1;
  while( true ) {
    if (p->nObjs <= v) {
      return 1;
    }
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    uVar6 = (uint)*(ulong *)pGVar2;
    uVar3 = *(ulong *)pGVar2 & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar6 < 0) {
      if ((~uVar6 & 0x9fffffff) == 0) {
        pwVar4 = Gia_ManObjSim(p,v);
        for (lVar7 = 0; lVar7 < p->nSimWords; lVar7 = lVar7 + 1) {
          wVar5 = Gia_ManRandomW(0);
          pwVar4[lVar7] = wVar5;
        }
      }
      else {
        if ((-1 < (int)uVar6) || ((int)uVar3 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                        ,0x6c,"int Gia_ManSimulateWords(Gia_Man_t *, int)");
        }
        Gia_ManObjSimPo(p,v);
      }
    }
    else {
      Gia_ManObjSimAnd(p,v);
    }
    v = v + 1;
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWords( Gia_Man_t * p, int nWords )
{
    Gia_Obj_t * pObj; int i;
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            Gia_ManObjSimPi( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}